

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixPath.cpp
# Opt level: O3

FileURL * __thiscall PosixPath::ToFileURL(FileURL *__return_storage_ptr__,PosixPath *this)

{
  _List_node_base *p_Var1;
  
  FileURL::FileURL(__return_storage_ptr__);
  FileURL::SetIsAbsolute(__return_storage_ptr__,this->mIsAbsolute);
  p_Var1 = (_List_node_base *)&this->mPathComponents;
  while (p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->mPathComponents) {
    FileURL::PushPathComponent(__return_storage_ptr__,(string *)(p_Var1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

FileURL PosixPath::ToFileURL() const
{
    FileURL aFileURL;
    
    aFileURL.SetIsAbsolute(IsAbsolute());
    
    StringList::const_iterator it = mPathComponents.begin();
    
    for(; it != mPathComponents.end(); ++it)
        aFileURL.PushPathComponent(*it);
    
    return aFileURL;    
}